

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunlinsol_spgmr_serial.c
# Opt level: O2

int check_vector(N_Vector X,N_Vector Y,sunrealtype tol)

{
  int iVar1;
  long lVar2;
  long lVar3;
  sunindextype sVar4;
  int iVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  
  lVar2 = N_VGetArrayPointer();
  lVar3 = N_VGetArrayPointer(Y);
  iVar5 = 0;
  for (lVar6 = 0; lVar6 < problem_size; lVar6 = lVar6 + 1) {
    iVar1 = SUNRCompareTol(*(undefined8 *)(lVar2 + lVar6 * 8),*(undefined8 *)(lVar3 + lVar6 * 8),tol
                          );
    iVar5 = iVar5 + iVar1;
  }
  if (iVar5 < 1) {
    iVar5 = 0;
  }
  else {
    lVar6 = 0;
    sVar4 = problem_size;
    if (problem_size < 1) {
      sVar4 = lVar6;
    }
    dVar7 = 0.0;
    for (; sVar4 != lVar6; lVar6 = lVar6 + 1) {
      dVar8 = *(double *)(lVar2 + lVar6 * 8);
      dVar8 = ABS((dVar8 - *(double *)(lVar3 + lVar6 * 8)) / dVar8);
      if (dVar8 <= dVar7) {
        dVar8 = dVar7;
      }
      dVar7 = dVar8;
    }
    printf("check err failure: maxerr = %g (tol = %g)\n",dVar7,tol);
    iVar5 = 1;
  }
  return iVar5;
}

Assistant:

int check_vector(N_Vector X, N_Vector Y, sunrealtype tol)
{
  int failure = 0;
  sunindextype i;
  sunrealtype *Xdata, *Ydata, maxerr;

  Xdata = N_VGetArrayPointer(X);
  Ydata = N_VGetArrayPointer(Y);

  /* check vector data */
  for (i = 0; i < problem_size; i++)
  {
    failure += SUNRCompareTol(Xdata[i], Ydata[i], tol);
  }

  if (failure > ZERO)
  {
    maxerr = ZERO;
    for (i = 0; i < problem_size; i++)
    {
      maxerr = SUNMAX(SUNRabs(Xdata[i] - Ydata[i]) / SUNRabs(Xdata[i]), maxerr);
    }
    printf("check err failure: maxerr = %" GSYM " (tol = %" GSYM ")\n", maxerr,
           tol);
    return (1);
  }
  else { return (0); }
}